

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O3

void __thiscall vera::Vbo::setDrawMode(Vbo *this,DrawMode _drawMode)

{
  if (_drawMode < (TRIANGLE_FAN|LINES)) {
    this->m_drawMode = *(GLenum *)(&DAT_002e1f38 + (ulong)_drawMode * 4);
  }
  return;
}

Assistant:

void Vbo::setDrawMode(DrawMode _drawMode) {
    if (_drawMode == POINTS)
        m_drawMode = GL_POINTS;
    else if (_drawMode == LINE_STRIP)
        m_drawMode = GL_LINE_STRIP;
    else if (_drawMode == LINE_LOOP)
        m_drawMode = GL_LINE_LOOP;
    else if (_drawMode == LINES)
        m_drawMode = GL_LINES;
    else if (_drawMode == TRIANGLES)
        m_drawMode = GL_TRIANGLES;
    else if (_drawMode == TRIANGLE_STRIP)
        m_drawMode = GL_TRIANGLE_STRIP;
    else if (_drawMode == TRIANGLE_FAN)
        m_drawMode = GL_TRIANGLE_FAN;
    // else if (_drawMode == QUADS)
    //     m_drawMode = GL_QUADS;
}